

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.hpp
# Opt level: O0

MDNode * LLVMBC::dyn_cast<LLVMBC::MDNode>(MDOperand *md)

{
  MetadataKind MVar1;
  MetadataKind MVar2;
  MDOperand *md_local;
  
  if (md == (MDOperand *)0x0) {
    md_local = (MDOperand *)0x0;
  }
  else {
    MVar1 = MDOperand::get_metadata_kind(md);
    MVar2 = MDNode::get_metadata_kind();
    md_local = md;
    if (MVar1 != MVar2) {
      md_local = (MDOperand *)0x0;
    }
  }
  return (MDNode *)md_local;
}

Assistant:

inline T *dyn_cast(MDOperand *md)
{
	if (!md)
		return nullptr;

	if (md->get_metadata_kind() == T::get_metadata_kind())
		return static_cast<T *>(md);
	else
		return nullptr;
}